

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPContentErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr ownerElem,xmlNodePtr child,char *message,char *content)

{
  char *msg;
  xmlChar *local_38;
  
  local_38 = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport(&local_38,(xmlChar *)0x0,ownerItem,ownerElem);
  if (child == (xmlNodePtr)0x0) {
    if (message == (char *)0x0) {
      child = (xmlNodePtr)0x0;
      msg = "%s: The content is not valid.\n";
    }
    else {
      msg = "%s: The content is not valid. Expected is %s.\n";
      child = (xmlNodePtr)message;
    }
  }
  else {
    msg = "%s: %s.\n";
  }
  xmlSchemaPErr2(ctxt,(xmlNodePtr)ownerItem,ownerElem,error,msg,local_38,(xmlChar *)child);
  if (local_38 != (xmlChar *)0x0) {
    (*xmlFree)(local_38);
  }
  return;
}

Assistant:

FREE_AND_NULL(msg)
}

/**
 * xmlSchemaPContentErr:
 * @ctxt: the schema parser context
 * @error: the error code
 * @ownerItem: the owner item of the holder of the content
 * @ownerElem: the node of the holder of the content
 * @child: the invalid child node
 * @message: the optional error message
 * @content: the optional string describing the correct content
 *
 * Reports an error concerning the content of a schema element.
 */
static void
xmlSchemaPContentErr(xmlSchemaParserCtxtPtr ctxt,
		     xmlParserErrors error,
		     xmlSchemaBasicItemPtr ownerItem,
		     xmlNodePtr ownerElem,
		     xmlNodePtr child,
		     const char *message,
		     const char *content)
{
    xmlChar *des = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, ownerItem, ownerElem);
    if (message != NULL)
	xmlSchemaPErr2(ctxt, ownerElem, child, error,
	    "%s: %s.\n",
	    BAD_CAST des, BAD_CAST message);
    else {
	if (content != NULL) {
	    xmlSchemaPErr2(ctxt, ownerElem, child, error,
		"%s: The content is not valid. Expected is %s.\n",
		BAD_CAST des, BAD_CAST content);
	} else {
	    xmlSchemaPErr2(ctxt, ownerElem, child, error,
		"%s: The content is not valid.\n",
		BAD_CAST des, NULL);
	}
    }
    FREE_AND_NULL(des)
}